

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O2

int IsStringInt(char *str)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  int i;
  size_t sVar4;
  ulong uVar5;
  
  if (str == (char *)0x0) {
    return 0;
  }
  if (*str == '\0') {
    return 0;
  }
  sVar3 = strlen(str);
  sVar4 = 0;
  while (sVar3 != sVar4) {
    pcVar1 = str + sVar4;
    sVar4 = sVar4 + 1;
    if (*pcVar1 != '-' && 9 < (byte)(*pcVar1 - 0x30U)) {
      return 0;
    }
  }
  uVar2 = 1;
  do {
    uVar5 = uVar2;
    if (sVar3 <= uVar5) break;
    uVar2 = uVar5 + 1;
  } while (str[uVar5] != '-');
  return (uint)(sVar3 <= uVar5);
}

Assistant:

int IsStringInt(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-')
            return FALSE;
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

	return TRUE;
}